

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::CheckType
          (SharedValidator *this,Location *loc,Type actual,Type expected,char *desc)

{
  Result RVar1;
  char *pcVar2;
  char *pcVar3;
  Type local_28;
  Type local_24;
  
  _local_28 = CONCAT44(actual.enum_,expected.enum_);
  RVar1 = TypeChecker::CheckType(actual,expected);
  if (RVar1.enum_ == Error) {
    pcVar2 = Type::GetName(&local_24);
    pcVar3 = Type::GetName(&local_28);
    PrintError(this,loc,"type mismatch at %s. got %s, expected %s",desc,pcVar2,pcVar3);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result SharedValidator::CheckType(const Location& loc,
                                  Type actual,
                                  Type expected,
                                  const char* desc) {
  if (Failed(TypeChecker::CheckType(actual, expected))) {
    PrintError(loc, "type mismatch at %s. got %s, expected %s", desc,
               actual.GetName(), expected.GetName());
    return Result::Error;
  }
  return Result::Ok;
}